

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

VW_HANDLE VW_SeedWithModel(VW_HANDLE handle,char *extraArgs)

{
  vw *pvVar1;
  string s;
  allocator local_51;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,extraArgs,&local_51);
  std::__cxx11::string::string((string *)&local_50,local_30);
  pvVar1 = VW::seed_vw_model((vw *)handle,&local_50,(trace_message_t)0x0,(void *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_SeedWithModel(VW_HANDLE handle, const char * extraArgs)
{
  string s(extraArgs);
  vw* origmodel = static_cast<vw*>(handle);
  vw* newmodel = VW::seed_vw_model(origmodel, s);
  return static_cast<VW_HANDLE>(newmodel);
}